

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_int,2ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
          *result)

{
  bool bVar1;
  allocator local_b9;
  string local_b8;
  optional<std::array<unsigned_int,_2UL>_> local_98;
  array<unsigned_int,_2UL> local_8c;
  array<unsigned_int,_2UL> value_1;
  char local_71;
  undefined1 local_70 [7];
  char c;
  allocator local_61;
  string local_60;
  array<unsigned_int,_2UL> local_40;
  array<unsigned_int,_2UL> value;
  vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
  *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  ::std::
  vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
  ::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = MaybeNone(this);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::optional
                ((optional<std::array<unsigned_int,_2UL>_> *)(value._M_elems + 1));
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
      ::push_back(result,(value_type *)(value._M_elems + 1));
      nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional
                ((optional<std::array<unsigned_int,_2UL>_> *)(value._M_elems + 1));
    }
    else {
      bVar1 = ParseBasicTypeTuple<unsigned_int,2ul>(this,&local_40);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_60,"Not starting with the tuple value of requested type.\n",
                   &local_61);
        PushError(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        return false;
      }
      nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::
      optional<std::array<unsigned_int,_2UL>_&,_0>
                ((optional<std::array<unsigned_int,_2UL>_> *)local_70,&local_40);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
      ::push_back(result,(value_type *)local_70);
      nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional
                ((optional<std::array<unsigned_int,_2UL>_> *)local_70);
    }
    while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_71);
      if (!bVar1) {
        return false;
      }
      if (local_71 != sep) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::optional
                  ((optional<std::array<unsigned_int,_2UL>_> *)(value_1._M_elems + 1));
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
        ::push_back(result,(value_type *)(value_1._M_elems + 1));
        nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional
                  ((optional<std::array<unsigned_int,_2UL>_> *)(value_1._M_elems + 1));
      }
      else {
        bVar1 = ParseBasicTypeTuple<unsigned_int,2ul>(this,&local_8c);
        if (!bVar1) break;
        nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::
        optional<std::array<unsigned_int,_2UL>_&,_0>(&local_98,&local_8c);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
        ::push_back(result,&local_98);
        nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional(&local_98);
      }
    }
    bVar1 = ::std::
            vector<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>_>_>
            ::empty(result);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_b8,"Empty array.\n",&local_b9);
      PushError(this,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}